

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall trackerboy::apu::Sequencer::run(Sequencer *this,Hardware *hw,uint32_t cycles)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  Trigger *trigger;
  uint32_t cycles_local;
  Hardware *hw_local;
  Sequencer *this_local;
  
  bVar3 = Timer::run(&this->mTimer,cycles);
  if (!bVar3) {
    return;
  }
  lVar1 = (ulong)this->mTriggerIndex * 0xc;
  iVar2 = *(int *)(TRIGGER_SEQUENCE + lVar1 + 8);
  if (iVar2 == 0) {
    Hardware::clockSweep(hw);
  }
  else if (iVar2 != 1) {
    if (iVar2 == 2) {
      Hardware::clockEnvelopes(hw);
    }
    goto LAB_00208314;
  }
  Hardware::clockLengthCounters(hw);
LAB_00208314:
  Timer::setPeriod(&this->mTimer,*(uint32_t *)(TRIGGER_SEQUENCE + lVar1 + 4));
  this->mTriggerIndex = *(uint32_t *)(TRIGGER_SEQUENCE + lVar1);
  return;
}

Assistant:

void Sequencer::run(Hardware &hw, uint32_t cycles) noexcept {
    if (mTimer.run(cycles)) {
        Trigger const &trigger = TRIGGER_SEQUENCE[mTriggerIndex];
        switch (trigger.type) {
            case TriggerType::lcSweep:
                hw.clockSweep();
                [[fallthrough]];
            case TriggerType::lc:
                hw.clockLengthCounters();
                break;
            case TriggerType::env:
                hw.clockEnvelopes();
                break;
        }
        mTimer.setPeriod(trigger.nextPeriod);
        mTriggerIndex = trigger.nextIndex;
    }
}